

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents)

{
  byte *oldp;
  size_t size;
  long lVar1;
  undefined1 miblen_00 [8];
  uint64_t uVar2;
  emitter_row_t eVar3;
  int iVar4;
  anon_struct_8_1_803fbc3e_for_cols aVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  uint uVar9;
  anon_struct_8_1_803fbc3e_for_cols aVar10;
  size_t sStack_370;
  undefined1 local_368 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_358 [4];
  undefined4 local_338;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_330;
  undefined4 local_310;
  ulong local_308 [4];
  undefined4 local_2e8;
  ulong local_2e0;
  undefined4 local_2c0;
  ulong local_2b8 [4];
  undefined4 local_298;
  ulong local_290;
  undefined4 local_270;
  ulong local_268 [4];
  undefined4 local_248;
  ulong local_240;
  undefined4 local_220;
  ulong local_218 [4];
  undefined4 local_1f8;
  ulong local_1f0;
  undefined4 local_1d0;
  undefined1 local_1c8 [32];
  size_t local_1a8;
  size_t mib [7];
  undefined1 local_120 [8];
  emitter_col_t name;
  emitter_col_t col32 [1];
  size_t metadata_thp;
  size_t resident;
  size_t mapped;
  size_t retained;
  size_t num_background_threads;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  uint64_t uptime;
  size_t sz_10;
  undefined8 local_80;
  size_t allocated;
  size_t active;
  size_t metadata;
  emitter_row_t row;
  size_t local_38;
  size_t miblen;
  
  aVar5.qlh_first = (emitter_col_t *)local_368;
  aVar10.qlh_first = (emitter_col_t *)local_368;
  local_368 = (undefined1  [8])0x8;
  sStack_370 = 0x13624b;
  iVar4 = je_mallctl("stats.allocated",&local_80,(size_t *)local_368,(void *)0x0,0);
  if (iVar4 == 0) {
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x136276;
    iVar4 = je_mallctl("stats.active",&allocated,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.active";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x1362a1;
    iVar4 = je_mallctl("stats.metadata",&active,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.metadata";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x1362cf;
    iVar4 = je_mallctl("stats.metadata_thp",&col32[0].link.qre_prev,(size_t *)local_368,(void *)0x0,
                       0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.metadata_thp";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x1362fd;
    iVar4 = je_mallctl("stats.resident",&metadata_thp,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.resident";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x13632b;
    iVar4 = je_mallctl("stats.mapped",&resident,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.mapped";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x136359;
    iVar4 = je_mallctl("stats.retained",&mapped,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.retained";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x136387;
    iVar4 = je_mallctl("stats.background_thread.num_threads",&retained,(size_t *)local_368,
                       (void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.background_thread.num_threads";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x1363b5;
    iVar4 = je_mallctl("stats.background_thread.num_runs",&num_background_threads,
                       (size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.background_thread.num_runs";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    local_368 = (undefined1  [8])0x8;
    sStack_370 = 0x1363ea;
    iVar4 = je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                       (size_t *)local_368,(void *)0x0,0);
    if (iVar4 != 0) {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "stats.background_thread.run_interval";
      aVar10.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00136cf0;
    }
    sStack_370 = 0x136401;
    emitter_json_object_kv_begin(emitter,"stats");
    sStack_370 = 0x136419;
    emitter_json_kv(emitter,"allocated",emitter_type_size,&local_80);
    sStack_370 = 0x13642e;
    emitter_json_kv(emitter,"active",emitter_type_size,&allocated);
    sStack_370 = 0x136443;
    emitter_json_kv(emitter,"metadata",emitter_type_size,&active);
    sStack_370 = 0x13645e;
    emitter_json_kv(emitter,"metadata_thp",emitter_type_size,&col32[0].link.qre_prev);
    sStack_370 = 0x136479;
    emitter_json_kv(emitter,"resident",emitter_type_size,&metadata_thp);
    sStack_370 = 0x136494;
    emitter_json_kv(emitter,"mapped",emitter_type_size,&resident);
    sStack_370 = 0x1364b4;
    emitter_json_kv(emitter,"retained",emitter_type_size,&mapped);
    emitter_table_printf
              (emitter,
               "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, retained: %zu\n"
               ,local_80,allocated,active,col32[0].link.qre_prev,metadata_thp,resident,mapped);
    sStack_370 = 0x136501;
    emitter_json_object_kv_begin(emitter,"background_thread");
    sStack_370 = 0x13651d;
    emitter_json_kv(emitter,"num_threads",emitter_type_size,&retained);
    sStack_370 = 0x13653c;
    emitter_json_kv(emitter,"num_runs",emitter_type_uint64,&num_background_threads);
    sStack_370 = 0x136558;
    emitter_json_kv(emitter,"run_interval",emitter_type_uint64,&background_thread_num_runs);
    sStack_370 = 0x136561;
    emitter_json_object_end(emitter);
    sStack_370 = 0x136580;
    emitter_table_printf
              (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",retained);
    if (mutex) {
      metadata = 0;
      sStack_370 = 0x1365b6;
      mutex_stats_init_cols
                ((emitter_row_t *)&metadata,"",(emitter_col_t *)local_120,(emitter_col_t *)local_368
                 ,(emitter_col_t *)&name.link.qre_prev);
      sStack_370 = 0x1365c1;
      emitter_table_row(emitter,(emitter_row_t *)&metadata);
      sStack_370 = 0x1365d0;
      emitter_json_object_kv_begin(emitter,"mutexes");
      local_38 = 7;
      uptime = 8;
      sStack_370 = 0x1365f9;
      iVar4 = je_mallctlnametomib("stats.arenas.0.uptime",&local_1a8,&local_38);
      if (iVar4 != 0) {
        pcVar7 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar6 = "stats.arenas.0.uptime";
        aVar10.qlh_first = (emitter_col_t *)local_368;
        goto LAB_00136cf0;
      }
      mib[1] = 0;
      pcVar6 = (char *)0x0;
      sStack_370 = 0x13662a;
      iVar4 = je_mallctlbymib(&local_1a8,local_38,&background_thread_run_interval,&uptime,
                              (void *)0x0,0);
      if (iVar4 != 0) goto LAB_00136cfc;
      aVar10.qlh_first = (emitter_col_t *)0x0;
      while (uVar2 = background_thread_run_interval, aVar10.qlh_first != (emitter_col_t *)0x3) {
        pcVar7 = global_mutex_names[(long)aVar10.qlh_first];
        sz = CONCAT44(sz._4_4_,4);
        sStack_370 = 0x136682;
        name._8_8_ = pcVar7;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"num_ops",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x1366a2;
        iVar4 = je_mallctl((char *)&local_1a8,local_358,&local_38,(void *)0x0,0);
        if (iVar4 != 0) {
LAB_00136ce2:
          pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
          pcVar6 = (char *)&local_1a8;
          aVar10.qlh_first = (emitter_col_t *)local_368;
          goto LAB_00136cf0;
        }
        local_338 = 4;
        if (local_358[0].uint64_val == 0 || uVar2 == 0) {
          local_330.uint64_val = 0;
        }
        else {
          local_330 = local_358[0];
          if (999999999 < uVar2) {
            local_330.uint64_val = local_358[0].uint64_val / (uVar2 / 1000000000);
          }
        }
        local_310 = 4;
        sStack_370 = 0x13671d;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"num_wait",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x13673d;
        iVar4 = je_mallctl((char *)&local_1a8,local_308,&local_38,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_00136ce2;
        local_2e8 = 4;
        if (local_308[0] == 0 || uVar2 == 0) {
          local_2e0 = 0;
        }
        else {
          local_2e0 = local_308[0];
          if (999999999 < uVar2) {
            local_2e0 = local_308[0] / (uVar2 / 1000000000);
          }
        }
        local_2c0 = 4;
        sStack_370 = 0x1367b8;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"num_spin_acq",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x1367d8;
        iVar4 = je_mallctl((char *)&local_1a8,local_2b8,&local_38,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_00136ce2;
        local_298 = 4;
        if (local_2b8[0] == 0 || uVar2 == 0) {
          local_290 = 0;
        }
        else {
          local_290 = local_2b8[0];
          if (999999999 < uVar2) {
            local_290 = local_2b8[0] / (uVar2 / 1000000000);
          }
        }
        local_270 = 4;
        sStack_370 = 0x136853;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"num_owner_switch",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x136873;
        iVar4 = je_mallctl((char *)&local_1a8,local_268,&local_38,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_00136ce2;
        local_248 = 4;
        if (local_268[0] == 0 || uVar2 == 0) {
          local_240 = 0;
        }
        else {
          local_240 = local_268[0];
          if (999999999 < uVar2) {
            local_240 = local_268[0] / (uVar2 / 1000000000);
          }
        }
        local_220 = 4;
        sStack_370 = 0x1368ee;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"total_wait_time",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x13690e;
        iVar4 = je_mallctl((char *)&local_1a8,local_218,&local_38,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_00136ce2;
        local_1f8 = 4;
        if (local_218[0] == 0 || uVar2 == 0) {
          local_1f0 = 0;
        }
        else {
          local_1f0 = local_218[0];
          if (999999999 < uVar2) {
            local_1f0 = local_218[0] / (uVar2 / 1000000000);
          }
        }
        local_1d0 = 4;
        sStack_370 = 0x136997;
        row.cols.qlh_first =
             (anon_struct_8_1_803fbc3e_for_cols)(anon_struct_8_1_803fbc3e_for_cols)aVar10.qlh_first;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"max_wait_time",pcVar6);
        local_38 = 8;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x1369ba;
        iVar4 = je_mallctl((char *)&local_1a8,local_1c8,&local_38,(void *)0x0,0);
        if (iVar4 != 0) goto LAB_00136ce2;
        col32[0].justify = emitter_justify_none|emitter_justify_right;
        sStack_370 = 0x1369e8;
        gen_mutex_ctl_str((char *)&local_1a8,0x1420f4,pcVar7,"max_num_thds",pcVar6);
        local_38 = 4;
        pcVar6 = (char *)0x0;
        sStack_370 = 0x136a07;
        iVar4 = je_mallctl((char *)&local_1a8,&col32[0].type,&local_38,(void *)0x0,0);
        eVar3 = row;
        if (iVar4 != 0) goto LAB_00136ce2;
        sStack_370 = 0x136a23;
        emitter_json_object_kv_begin(emitter,global_mutex_names[(long)row.cols.qlh_first]);
        sStack_370 = 0x136a3d;
        mutex_stats_emit(emitter,(emitter_row_t *)&metadata,(emitter_col_t *)local_368,
                         (emitter_col_t *)&name.link.qre_prev);
        sStack_370 = 0x136a45;
        emitter_json_object_end(emitter);
        aVar10 = eVar3.cols.qlh_first + 1;
      }
      sStack_370 = 0x136a5c;
      emitter_json_object_end(emitter);
    }
    sStack_370 = 0x136a64;
    emitter_json_object_end(emitter);
    if ((!merged && !destroyed) && !unmerged) {
      return;
    }
    sStack_370 = 0x136a84;
    emitter_json_object_kv_begin(emitter,"stats.arenas");
    local_368 = (undefined1  [8])0x4;
    sStack_370 = 0x136aa7;
    iVar4 = je_mallctl("arenas.narenas",&local_38,(size_t *)local_368,(void *)0x0,0);
    if (iVar4 == 0) {
      local_120 = (undefined1  [8])0x3;
      lVar1 = -((local_38 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
      aVar5.qlh_first = (emitter_col_t *)(local_368 + lVar1);
      sz_10 = (size_t)local_368;
      row.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)(anon_struct_8_1_803fbc3e_for_cols)aVar5.qlh_first;
      *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136aec;
      iVar4 = je_mallctlnametomib("arena.0.initialized",(size_t *)local_368,(size_t *)local_120);
      if (iVar4 == 0) {
        uVar9 = 0;
        for (uVar8 = 0; miblen_00 = local_120, uVar8 < (local_38 & 0xffffffff); uVar8 = uVar8 + 1) {
          name.link.qre_prev = (emitter_col_t *)0x1;
          oldp = (byte *)((long)row.cols.qlh_first + uVar8);
          sz = uVar8;
          *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136b45;
          iVar4 = je_mallctlbymib((size_t *)local_368,(size_t)miblen_00,oldp,
                                  (size_t *)&name.link.qre_prev,(void *)0x0,0);
          if (iVar4 != 0) goto LAB_00136cfc;
          uVar9 = uVar9 + *oldp;
        }
        sz = 0x1001;
        name.link.qre_prev = (emitter_col_t *)0x1;
        *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136b8c;
        iVar4 = je_mallctlbymib((size_t *)local_368,(size_t)miblen_00,&metadata,
                                (size_t *)&name.link.qre_prev,(void *)0x0,0);
        if (iVar4 == 0) {
          if ((merged) && (1 < uVar9 || !unmerged)) {
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136bd3;
            emitter_table_printf(emitter,"Merged arenas stats:\n");
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136be2;
            emitter_json_object_kv_begin(emitter,"merged");
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136bfb;
            stats_arena_print(emitter,0x1000,bins,large,mutex,extents);
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c03;
            emitter_json_object_end(emitter);
          }
          if ((destroyed & (byte)metadata) == 1) {
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c1e;
            emitter_table_printf(emitter,"Destroyed arenas stats:\n");
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c2d;
            emitter_json_object_kv_begin(emitter,"destroyed");
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c46;
            stats_arena_print(emitter,0x1001,bins,large,mutex,extents);
            *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c4e;
            emitter_json_object_end(emitter);
          }
          if (unmerged) {
            for (uVar8 = 0; uVar8 < (local_38 & 0xffffffff); uVar8 = uVar8 + 1) {
              if (*(char *)((long)row.cols.qlh_first + uVar8) == '\x01') {
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x14;
                size = *(size_t *)((long)&sStack_370 + lVar1);
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c85;
                malloc_snprintf((char *)&local_1a8,size,"%u",uVar8 & 0xffffffff);
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136c90;
                emitter_json_object_kv_begin(emitter,(char *)&local_1a8);
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136ca4;
                emitter_table_printf(emitter,"arenas[%s]:\n",&local_1a8);
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136cba;
                stats_arena_print(emitter,(uint)uVar8,bins,large,mutex,extents);
                *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136cc2;
                emitter_json_object_end(emitter);
              }
            }
          }
          *(undefined8 *)((long)&sStack_370 + lVar1) = 0x136ccf;
          emitter_json_object_end(emitter);
          return;
        }
LAB_00136cfc:
        aVar5.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x136d08;
        malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        aVar5.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x136d0d;
        abort();
      }
      pcVar7 = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar6 = "arena.0.initialized";
      aVar10.qlh_first = aVar5.qlh_first;
    }
    else {
      pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar6 = "arenas.narenas";
      aVar10.qlh_first = (emitter_col_t *)local_368;
    }
  }
  else {
    pcVar7 = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar6 = "stats.allocated";
  }
LAB_00136cf0:
  aVar10.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x136cf7;
  malloc_printf(pcVar7,pcVar6);
  aVar10.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x136cfc;
  abort();
}

Assistant:

static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_thp, resident, mapped,
	    retained;
	size_t num_background_threads;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, "
	    "retained: %zu\n", allocated, active, metadata, metadata_thp,
	    resident, mapped, retained);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(global_mutex_names[i], &name,
			    col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, j, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = j = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}